

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O3

char * __thiscall google::protobuf::Value::_InternalParse(Value *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  KindUnion *this_01;
  string *psVar1;
  byte bVar2;
  byte bVar3;
  internal *this_02;
  char *size;
  bool bVar4;
  byte *pbVar5;
  Struct *pSVar6;
  ListValue *msg;
  uint uVar7;
  char *field_name;
  uint32 res32;
  Arena *pAVar8;
  UnknownFieldSet *unknown;
  char cVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->kind_;
  local_38 = (byte *)ptr;
  do {
    bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_38;
    }
    bVar2 = *local_38;
    uVar10 = (uint)bVar2;
    pbVar5 = local_38 + 1;
    if ((char)bVar2 < '\0') {
      bVar3 = local_38[1];
      uVar10 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
      if ((char)bVar3 < '\0') {
        pVar13 = internal::ReadTagFallback((char *)local_38,uVar10);
        if ((byte *)pVar13.first == (byte *)0x0) {
          return (char *)0x0;
        }
        uVar10 = pVar13.second;
        pbVar5 = (byte *)pVar13.first;
      }
      else {
        pbVar5 = local_38 + 2;
      }
    }
    local_38 = pbVar5;
    uVar7 = (uVar10 >> 3) - 1;
    if (5 < uVar7) {
switchD_0020bff4_default:
      if ((uVar10 == 0) || ((uVar10 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
        return (char *)local_38;
      }
      if (((ulong)this_00->ptr_ & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)internal::UnknownFieldParse((ulong)uVar10,unknown,(char *)local_38,ctx);
      goto joined_r0x0020c311;
    }
    field_name = (char *)((long)&switchD_0020bff4::switchdataD_00350818 +
                         (long)(int)(&switchD_0020bff4::switchdataD_00350818)[uVar7]);
    cVar9 = (char)uVar10;
    switch(uVar10 >> 3) {
    case 1:
      if (cVar9 != '\b') goto switchD_0020bff4_default;
      uVar12 = (ulong)(char)*local_38;
      pbVar5 = local_38 + 1;
      if ((long)uVar12 < 0) {
        uVar10 = ((uint)*pbVar5 * 0x80 + (uint)*local_38) - 0x80;
        if (-1 < (char)*pbVar5) {
          uVar12 = (ulong)uVar10;
          pbVar5 = local_38 + 2;
          goto LAB_0020c030;
        }
        pVar14 = internal::VarintParseSlow64((char *)local_38,uVar10);
        iVar11 = (int)pVar14.second;
        local_38 = (byte *)pVar14.first;
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else {
LAB_0020c030:
        iVar11 = (int)uVar12;
        local_38 = pbVar5;
      }
      if (this->_oneof_case_[0] != 1) {
        clear_kind(this);
        this->_oneof_case_[0] = 1;
      }
      this_01->null_value_ = iVar11;
      goto LAB_0020c1c6;
    case 2:
      if (cVar9 != '\x11') goto switchD_0020bff4_default;
      psVar1 = *(string **)local_38;
      if (this->_oneof_case_[0] != 2) {
        clear_kind(this);
        this->_oneof_case_[0] = 2;
      }
      (this_01->string_value_).ptr_ = psVar1;
      local_38 = local_38 + 8;
LAB_0020c1c6:
      cVar9 = '\x02';
      goto LAB_0020c313;
    case 3:
      if (cVar9 != '\x1a') goto switchD_0020bff4_default;
      if (this->_oneof_case_[0] != 3) {
        clear_kind(this);
        this->_oneof_case_[0] = 3;
        (this->kind_).struct_value_ = (Struct *)&internal::fixed_address_empty_string_abi_cxx11_;
      }
      pAVar8 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      pSVar6 = this_01->struct_value_;
      if (pSVar6 == (Struct *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (&this_01->string_value_,pAVar8,
                   (string *)&internal::fixed_address_empty_string_abi_cxx11_);
        pSVar6 = this_01->struct_value_;
      }
      local_38 = (byte *)internal::InlineGreedyStringParser((string *)pSVar6,(char *)local_38,ctx);
      this_02 = (internal *)(pSVar6->super_Message).super_MessageLite._vptr_MessageLite;
      size = (char *)(pSVar6->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      str.length_ = (stringpiece_ssize_type)"google.protobuf.Value.string_value";
      str.ptr_ = size;
      bVar4 = internal::VerifyUTF8(this_02,str,field_name);
      if (!bVar4) {
        return (char *)0x0;
      }
      cVar9 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      goto LAB_0020c313;
    case 4:
      if (cVar9 != ' ') goto switchD_0020bff4_default;
      bVar2 = *local_38;
      pVar14.second = (long)(char)bVar2;
      pVar14.first = (char *)(local_38 + 1);
      if ((long)(char)bVar2 < 0) {
        bVar3 = local_38[1];
        res32 = ((uint)bVar3 * 0x80 + (uint)bVar2) - 0x80;
        if ((char)bVar3 < '\0') {
          pVar14 = internal::VarintParseSlow64((char *)local_38,res32);
        }
        else {
          pVar14.second._0_4_ = res32;
          pVar14.first = (char *)(local_38 + 2);
          pVar14.second._4_4_ = 0;
        }
      }
      local_38 = (byte *)pVar14.first;
      if (this->_oneof_case_[0] != 4) {
        clear_kind(this);
        this->_oneof_case_[0] = 4;
      }
      this_01->bool_value_ = pVar14.second != 0;
      break;
    case 5:
      if (cVar9 != '*') goto switchD_0020bff4_default;
      if (this->_oneof_case_[0] == 5) {
        pSVar6 = this_01->struct_value_;
      }
      else {
        clear_kind(this);
        this->_oneof_case_[0] = 5;
        pAVar8 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        pSVar6 = Arena::CreateMaybeMessage<google::protobuf::Struct>(pAVar8);
        this_01->struct_value_ = pSVar6;
      }
      local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Struct>
                                   (ctx,pSVar6,(char *)local_38);
      break;
    case 6:
      if (cVar9 != '2') goto switchD_0020bff4_default;
      if (this->_oneof_case_[0] == 6) {
        msg = this_01->list_value_;
      }
      else {
        clear_kind(this);
        this->_oneof_case_[0] = 6;
        pAVar8 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        msg = Arena::CreateMaybeMessage<google::protobuf::ListValue>(pAVar8);
        this_01->list_value_ = msg;
      }
      local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::ListValue>
                                   (ctx,msg,(char *)local_38);
    }
joined_r0x0020c311:
    cVar9 = '\x02';
    if (local_38 == (byte *)0x0) {
      return (char *)0x0;
    }
LAB_0020c313:
    if (cVar9 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Value::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // .google.protobuf.NullValue null_value = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_null_value(static_cast<PROTOBUF_NAMESPACE_ID::NullValue>(val));
        } else goto handle_unusual;
        continue;
      // double number_value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 17)) {
          _internal_set_number_value(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // string string_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_string_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Value.string_value"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bool bool_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _internal_set_bool_value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Struct struct_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_struct_value(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.ListValue list_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr = ctx->ParseMessage(_internal_mutable_list_value(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}